

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn3.hpp
# Opt level: O0

void __thiscall trng::yarn3::split(yarn3 *this,uint s,uint n)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  uint in_EDX;
  uint in_ESI;
  undefined4 *in_RDI;
  int i;
  int32_t b [9];
  int32_t a [3];
  int32_t q5;
  int32_t q4;
  int32_t q3;
  int32_t q2;
  int32_t q1;
  int32_t q0;
  invalid_argument *this_00;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int iVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  int32_t in_stack_ffffffffffffffd4;
  int32_t (*in_stack_ffffffffffffffd8) [3];
  int32_t (*in_stack_ffffffffffffffe0) [9];
  
  if ((in_ESI == 0) || (in_ESI <= in_EDX)) {
    this_00 = (invalid_argument *)&stack0xffffffffffffffe0;
    std::invalid_argument::invalid_argument(this_00,"invalid argument for trng::yarn3::split");
    utility::throw_this<std::invalid_argument>(this_00);
    std::invalid_argument::~invalid_argument((invalid_argument *)&stack0xffffffffffffffe0);
  }
  if (1 < in_ESI) {
    jump((yarn3 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
         (unsigned_long_long)in_RDI);
    uVar1 = in_RDI[3];
    jump((yarn3 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
         (unsigned_long_long)in_RDI);
    uVar2 = in_RDI[3];
    jump((yarn3 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
         (unsigned_long_long)in_RDI);
    uVar3 = in_RDI[3];
    jump((yarn3 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
         (unsigned_long_long)in_RDI);
    uVar4 = in_RDI[3];
    jump((yarn3 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
         (unsigned_long_long)in_RDI);
    uVar5 = in_RDI[3];
    jump((yarn3 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
         (unsigned_long_long)in_RDI);
    uVar6 = in_RDI[3];
    uVar8 = uVar1;
    uVar9 = uVar4;
    int_math::gauss<3>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4
                      );
    *in_RDI = uVar4;
    in_RDI[1] = uVar5;
    in_RDI[2] = uVar6;
    in_RDI[3] = uVar3;
    in_RDI[4] = uVar2;
    in_RDI[5] = uVar1;
    for (iVar7 = 0; iVar7 < 3; iVar7 = iVar7 + 1) {
      backward((yarn3 *)CONCAT44(uVar9,uVar8));
    }
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn3::split(unsigned int s, unsigned int n) {
#if !(defined TRNG_CUDA)
    if (s < 1 or n >= s)
      utility::throw_this(std::invalid_argument("invalid argument for trng::yarn3::split"));
#endif
    if (s > 1) {
      jump(n + 1ull);
      const int32_t q0{S.r[0]};
      jump(s);
      const int32_t q1{S.r[0]};
      jump(s);
      const int32_t q2{S.r[0]};
      jump(s);
      const int32_t q3{S.r[0]};
      jump(s);
      const int32_t q4{S.r[0]};
      jump(s);
      const int32_t q5{S.r[0]};
      int32_t a[3], b[9];
      a[0] = q3;
      b[0] = q2;
      b[1] = q1;
      b[2] = q0;
      a[1] = q4;
      b[3] = q3;
      b[4] = q2;
      b[5] = q1;
      a[2] = q5;
      b[6] = q4;
      b[7] = q3;
      b[8] = q2;
      int_math::gauss<3>(b, a, modulus);
      P.a[0] = a[0];
      P.a[1] = a[1];
      P.a[2] = a[2];
      S.r[0] = q2;
      S.r[1] = q1;
      S.r[2] = q0;
      for (int i{0}; i < 3; ++i)
        backward();
    }
  }